

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::torrent::want_tick(torrent *this)

{
  bool bVar1;
  int iVar2;
  torrent *this_local;
  
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) {
    bVar1 = ::std::
            vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ::empty(&(this->super_torrent_hot_members).m_connections.
                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   );
    if (bVar1) {
      bVar1 = is_finished(this);
      if (((!bVar1) &&
          (bVar1 = ::std::__cxx11::
                   list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::
                   empty(&this->m_web_seeds), !bVar1)) && (((byte)this->field_0x5c0 >> 3 & 1) != 0))
      {
        return true;
      }
      iVar2 = stat::low_pass_upload_rate(&this->m_stat);
      if ((iVar2 < 1) && (iVar2 = stat::low_pass_download_rate(&this->m_stat), iVar2 < 1)) {
        if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1b & 1) == 0) &&
           ((*(uint *)&this->field_0x600 >> 6 & 1) == 0)) {
          return true;
        }
        return false;
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool torrent::want_tick() const
	{
		if (m_abort) return false;

		if (!m_connections.empty()) return true;

		// we might want to connect web seeds
		if (!is_finished() && !m_web_seeds.empty() && m_files_checked)
			return true;

		if (m_stat.low_pass_upload_rate() > 0 || m_stat.low_pass_download_rate() > 0)
			return true;

		// if we don't get ticks we won't become inactive
		if (!m_paused && !m_inactive) return true;

		return false;
	}